

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

bool __thiscall cmFileListGeneratorBase::Search(cmFileListGeneratorBase *this,cmFileList *listing)

{
  int iVar1;
  allocator<char> local_39;
  string local_38 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_38,"",&local_39);
  iVar1 = (*this->_vptr_cmFileListGeneratorBase[2])(this,local_38,listing);
  std::__cxx11::string::~string(local_38);
  return SUB41(iVar1,0);
}

Assistant:

bool cmFileListGeneratorBase::Search(cmFileList& listing)
{
  return this->Search("", listing);
}